

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O1

vector<Config::Size,_std::allocator<Config::Size>_> *
App::arrangeGlyphs(vector<Config::Size,_std::allocator<Config::Size>_> *__return_storage_ptr__,
                  Glyphs *glyphs,Config *config)

{
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  iterator __position;
  Glyphs *this;
  uint32_t uVar4;
  RectSize *i;
  pointer pRVar5;
  pointer pSVar6;
  mapped_type *pmVar7;
  runtime_error *this_00;
  uint32_t uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint32_t uVar13;
  uint width;
  uint32_t *__k;
  pointer pRVar14;
  ulong uVar15;
  uint32_t uVar16;
  Size lastSize;
  vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> glyphRectangles;
  vector<rbp::Rect,_std::allocator<rbp::Rect>_> arrangedRectangles;
  vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> glyphRectanglesCopy;
  MaxRectsBinPack mrbp;
  Size local_e8;
  vector<Config::Size,std::allocator<Config::Size>> *local_e0;
  vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> local_d8;
  uint32_t local_c0;
  uint32_t local_bc;
  pointer local_b8;
  pointer local_b0;
  vector<rbp::Rect,_std::allocator<rbp::Rect>_> local_a8;
  Config *local_90;
  Glyphs *local_88;
  vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> local_80;
  MaxRectsBinPack local_68;
  
  uVar8 = (config->padding).up;
  uVar4 = (config->padding).left;
  uVar13 = (config->spacing).hor;
  uVar16 = (config->padding).right;
  uVar2 = (config->spacing).ver;
  uVar3 = (config->padding).down;
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = (vector<Config::Size,std::allocator<Config::Size>> *)__return_storage_ptr__;
  getGlyphRectangles(&local_d8,glyphs,uVar4 + uVar13 + uVar16,uVar8 + uVar2 + uVar3,config);
  rbp::MaxRectsBinPack::MaxRectsBinPack(&local_68);
  local_90 = config;
  local_88 = glyphs;
  do {
    local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>::vector(&local_80,&local_d8);
    local_e8.w = 0;
    local_e8.h = 0;
    uVar15 = 0;
    for (pRVar5 = local_d8.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl
                  .super__Vector_impl_data._M_start;
        pRVar5 != local_d8.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl
                  .super__Vector_impl_data._M_finish; pRVar5 = pRVar5 + 1) {
      uVar15 = uVar15 + (long)pRVar5->height * (long)pRVar5->width;
    }
    pSVar6 = (config->textureSizeList).
             super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(config->textureSizeList).
                  super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pSVar6;
    if (lVar9 != 0) {
      uVar10 = lVar9 >> 3;
      uVar11 = 0;
      do {
        width = pSVar6[uVar11].w - (config->spacing).hor;
        uVar12 = pSVar6[uVar11].h - (config->spacing).ver;
        uVar1 = uVar11 + 1;
        if ((uVar10 <= uVar1) || (lVar9 = 0, uVar15 <= (ulong)uVar12 * (ulong)width)) {
          local_e8 = pSVar6[uVar11];
          std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>::operator=(&local_d8,&local_80)
          ;
          rbp::MaxRectsBinPack::Init(&local_68,width,uVar12);
          rbp::MaxRectsBinPack::Insert(&local_68,&local_d8,&local_a8,RectBestAreaFit);
          lVar9 = 0;
          if (local_d8.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_d8.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar9 = 6;
          }
        }
        if (lVar9 != 0) break;
        pSVar6 = (config->textureSizeList).
                 super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = (long)(config->textureSizeList).
                       super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pSVar6 >> 3;
        uVar11 = uVar1;
      } while (uVar1 < uVar10);
    }
    local_b0 = local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pRVar14 = local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_d8.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_d8.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"can not fit glyphs into texture");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar4 = 0;
      uVar8 = 0;
      local_b8 = local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pRVar14 = local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        this = local_88;
        uVar16 = (config->spacing).hor + pRVar14->x;
        uVar13 = (config->spacing).ver + pRVar14->y;
        __k = &pRVar14->tag;
        local_c0 = uVar8;
        local_bc = uVar4;
        pmVar7 = std::
                 map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
                 ::operator[](local_88,__k);
        pmVar7->x = uVar16;
        pmVar7 = std::
                 map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
                 ::operator[](this,__k);
        pmVar7->y = uVar13;
        lVar9 = *(long *)local_e0;
        pSVar6 = *(pointer *)(local_e0 + 8);
        pmVar7 = std::
                 map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
                 ::operator[](this,__k);
        config = local_90;
        pmVar7->page = (uint32_t)((ulong)((long)pSVar6 - lVar9) >> 3);
        uVar12 = uVar16 + pRVar14->width;
        uVar8 = local_c0;
        if (local_c0 <= uVar12) {
          uVar8 = uVar12;
        }
        uVar12 = uVar13 + pRVar14->height;
        uVar4 = local_bc;
        if (local_bc <= uVar12) {
          uVar4 = uVar12;
        }
        pRVar14 = pRVar14 + 1;
      } while (pRVar14 != local_b0);
      if (local_90->cropTexturesWidth != false) {
        local_e8.w = uVar8;
      }
      if (local_90->cropTexturesHeight == true) {
        local_e8.h = uVar4;
      }
      __position._M_current = *(Size **)(local_e0 + 8);
      if (__position._M_current == *(Size **)(local_e0 + 0x10)) {
        std::vector<Config::Size,std::allocator<Config::Size>>::
        _M_realloc_insert<Config::Size_const&>(local_e0,__position,&local_e8);
        pRVar14 = local_b8;
      }
      else {
        *__position._M_current = local_e8;
        *(long *)(local_e0 + 8) = *(long *)(local_e0 + 8) + 8;
        pRVar14 = local_b8;
      }
    }
    if (local_80.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (pRVar14 == local_b0) {
      if (local_68.freeRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.freeRectangles.
                        super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_68.usedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.usedRectangles.
                        super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_d8.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return (vector<Config::Size,_std::allocator<Config::Size>_> *)local_e0;
    }
  } while( true );
}

Assistant:

std::vector<Config::Size> App::arrangeGlyphs(Glyphs& glyphs, const Config& config)
{
    const auto additionalWidth = config.spacing.hor + config.padding.left + config.padding.right;
    const auto additionalHeight = config.spacing.ver + config.padding.up + config.padding.down;
    std::vector<Config::Size> result;

    auto glyphRectangles = getGlyphRectangles(glyphs, additionalWidth, additionalHeight, config);

    rbp::MaxRectsBinPack mrbp;

    for (;;)
    {
        std::vector<rbp::Rect> arrangedRectangles;
        auto glyphRectanglesCopy = glyphRectangles;
        Config::Size lastSize;

        uint64_t allGlyphSquare = 0;
        for (const auto& i : glyphRectangles)
            allGlyphSquare += static_cast<uint64_t>(i.width) * i.height;

        for (size_t i = 0; i < config.textureSizeList.size(); ++i)
        {
            const auto& ss = config.textureSizeList[i];

            //TODO: check workAreaW,H
            const auto workAreaW = ss.w - config.spacing.hor;
            const auto workAreaH = ss.h - config.spacing.ver;

            uint64_t textureSquare = static_cast<uint64_t>(workAreaW) * workAreaH;
            if (textureSquare < allGlyphSquare && i + 1 < config.textureSizeList.size())
                continue;

            lastSize = ss;
            glyphRectangles = glyphRectanglesCopy;

            mrbp.Init(workAreaW, workAreaH);
            mrbp.Insert(glyphRectangles, arrangedRectangles, rbp::MaxRectsBinPack::RectBestAreaFit);

            if (glyphRectangles.empty())
                break;
        }

        if (arrangedRectangles.empty())
        {
            if (!glyphRectangles.empty())
                throw std::runtime_error("can not fit glyphs into texture");
            break;
        }

        std::uint32_t maxX = 0;
        std::uint32_t maxY = 0;
        for (const auto& r: arrangedRectangles)
        {
            std::uint32_t x = r.x + config.spacing.hor;
            std::uint32_t y = r.y + config.spacing.ver;

            glyphs[r.tag].x = x;
            glyphs[r.tag].y = y;
            glyphs[r.tag].page = static_cast<std::uint32_t>(result.size());

            if (maxX < x + r.width)
                maxX = x + r.width;
            if (maxY < y + r.height)
                maxY = y + r.height;
        }
        if (config.cropTexturesWidth)
            lastSize.w = maxX;
        if (config.cropTexturesHeight)
            lastSize.h = maxY;

        result.push_back(lastSize);
    }

    return result;
}